

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprCompareSkip(Expr *pA,Expr *pB,int iTab)

{
  int iVar1;
  Expr *pA_00;
  undefined4 in_EDX;
  Expr *in_RSI;
  Expr *in_RDI;
  Expr *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  
  pA_00 = sqlite3ExprSkipCollate(in_RDI);
  sqlite3ExprSkipCollate(in_RSI);
  iVar1 = sqlite3ExprCompare((Parse *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),pA_00,
                             in_stack_ffffffffffffffd8,0);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCompareSkip(Expr *pA, Expr *pB, int iTab){
  return sqlite3ExprCompare(0,
             sqlite3ExprSkipCollate(pA),
             sqlite3ExprSkipCollate(pB),
             iTab);
}